

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

const_iterator * __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::begin
          (Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this)

{
  InnerMap *in_RDI;
  InnerIt local_38;
  Node *in_stack_ffffffffffffffe0;
  
  InnerMap::begin(in_RDI);
  iterator::iterator((iterator *)&stack0xffffffffffffffe0,&local_38);
  protobuf::Map::iterator::operator_cast_to_const_iterator((iterator *)in_stack_ffffffffffffffe0);
  return (const_iterator *)in_RDI;
}

Assistant:

const_iterator begin() const {
    return const_iterator(iterator(elements_->begin()));
  }